

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::insert<kj::StringPtr,kj::StringPtr>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,size_t pos,StringPtr *params)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  uint uVar8;
  size_t sVar9;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_00;
  StringPtr *pSVar10;
  size_t *in_R9;
  HashBucket *_s944;
  HashBucket *pHVar11;
  HashBucket *pHVar12;
  StringPtr str;
  StringPtr a;
  StringPtr b;
  Maybe<unsigned_long> MVar13;
  
  this_00 = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.ptr;
  uVar6 = (this_00->erasedCount + pos) * 3 + 3;
  pSVar10 = params;
  if ((this_00->buckets).size_ * 2 < uVar6) {
    rehash(this_00,pos * 3 + 3);
    uVar6 = extraout_RDX;
  }
  str.content.size_ = uVar6;
  str.content.ptr = (char *)in_R9[1];
  uVar3 = _::anon_unknown_0::StringHasher::hashCode((StringHasher *)*in_R9,str);
  sVar4 = (this_00->buckets).size_;
  uVar8 = (int)sVar4 - 1U & uVar3;
  pHVar11 = (HashBucket *)0x0;
  aVar7 = extraout_RDX_00;
  do {
    pHVar12 = (this_00->buckets).ptr + uVar8;
    uVar1 = pHVar12->value;
    if (uVar1 == 1) {
      if (pHVar11 == (HashBucket *)0x0) {
        pHVar11 = pHVar12;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar11 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar12 = pHVar11;
        }
        *pHVar12 = (HashBucket)(((ulong)uVar3 | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
LAB_0014ea5c:
        MVar13.ptr.field_1.value = aVar7.value;
        MVar13.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar13.ptr;
      }
      if (pHVar12->hash == uVar3) {
        lVar5 = (ulong)(uVar1 - 2) * 0x10;
        a.content.size_ = *in_R9;
        a.content.ptr = *(char **)(table.size_ + 8 + lVar5);
        b.content.size_ = (size_t)pSVar10;
        b.content.ptr = (char *)in_R9[1];
        bVar2 = _::anon_unknown_0::StringHasher::matches
                          (*(StringHasher **)(table.size_ + lVar5),a,b);
        aVar7 = extraout_RDX_01;
        if (bVar2) {
          uVar3 = pHVar12->value;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar3 - 2);
          goto LAB_0014ea5c;
        }
        sVar4 = (this_00->buckets).size_;
      }
    }
    sVar9 = (ulong)uVar8 + 1;
    uVar8 = (uint)sVar9;
    if (sVar9 == sVar4) {
      uVar8 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }